

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

char ** Map_CloneVector(char **source,size_t count)

{
  int iVar1;
  char **__ptr;
  char **destination;
  size_t i;
  size_t sVar2;
  size_t j;
  size_t sVar3;
  
  __ptr = (char **)malloc(count * 8);
  if (__ptr == (char **)0x0) {
LAB_00110080:
    __ptr = (char **)0x0;
  }
  else {
    destination = __ptr;
    for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
      iVar1 = mallocAndStrcpy_s(destination,source[sVar2]);
      if (iVar1 != 0) {
        if (count == sVar2) {
          return __ptr;
        }
        for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
          free(__ptr[sVar3]);
        }
        free(__ptr);
        goto LAB_00110080;
      }
      destination = destination + 1;
    }
  }
  return __ptr;
}

Assistant:

static char** Map_CloneVector(const char*const * source, size_t count)
{
    char** result;
    result = (char**)malloc(count *sizeof(char*));
    if (result == NULL)
    {
        /*do nothing, just return it (NULL)*/
    }
    else
    {
        size_t i;
        for (i = 0; i < count; i++)
        {
            if (mallocAndStrcpy_s(result + i, source[i]) != 0)
            {
                break;
            }
        }

        if (i == count)
        {
            /*it is all good, proceed to return result*/
        }
        else
        {
            size_t j;
            for (j = 0; j < i; j++)
            {
                free(result[j]);
            }
            free(result);
            result = NULL;
        }
    }
    return result;
}